

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  IdxElement *in_RDX;
  int in_ESI;
  IdxElement tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  IdxElement *in_stack_fffffffffffffe68;
  IdxElement *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 uVar3;
  IdxElement *in_stack_fffffffffffffe88;
  IdxElement *in_stack_fffffffffffffe90;
  IdxCompare *in_stack_fffffffffffffe98;
  int local_30;
  int local_2c;
  int local_20;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[local_20];
    iVar2 = iVar1 + in_ECX;
    for (local_2c = iVar2; local_2c <= in_ESI; local_2c = local_2c + 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_30 = local_2c;
      while( true ) {
        uVar3 = false;
        if (iVar2 <= local_30) {
          in_stack_fffffffffffffe70 = in_RDX;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::IdxElement(in_RDX,in_stack_fffffffffffffe68);
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::IdxElement(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          uVar3 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(uVar3,in_stack_fffffffffffffe78),
                             &in_stack_fffffffffffffe70->idx);
        }
        if ((type_conflict5)uVar3 == false) break;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        local_30 = local_30 - iVar1;
      }
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}